

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_method.cpp
# Opt level: O1

void mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm
               (MPI_Comm cart_comm,int ndims,int *stencil,int num_neighbors,int *dims,int *periods,
               MPI_Comm *dist_graph_comm)

{
  long lVar1;
  MPI_Comm poVar2;
  pointer piVar3;
  int iVar4;
  undefined8 auStackY_a0 [3];
  undefined1 auStack_78 [8];
  int *local_70;
  int *local_68;
  MPI_Comm local_60;
  vector<int,_std::allocator<int>_> local_58;
  int local_38;
  int local_34;
  int cart_rank;
  int real_neighbors_size;
  
  local_70 = periods;
  local_68 = dims;
  MPI_Comm_rank(cart_comm,&local_38);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auStackY_a0[2] = 0x134d3c;
  local_60 = cart_comm;
  get_neighbors_from_stencil
            (cart_comm,local_38,ndims,stencil,num_neighbors,local_68,local_70,&local_58);
  iVar4 = (int)((ulong)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  lVar1 = -(((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start & 0x3fffffffcU) + 0xf & 0xfffffffffffffff0);
  local_34 = iVar4;
  if (0 < (long)iVar4) {
    *(undefined8 *)(&stack0xffffffffffffff80 + lVar1) = 0x134d8f;
    memset(auStack_78 + lVar1,0,(long)iVar4 * 4);
  }
  piVar3 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  poVar2 = local_60;
  *(MPI_Comm **)(&stack0xffffffffffffff78 + lVar1) = dist_graph_comm;
  *(undefined8 *)((long)auStackY_a0 + lVar1 + 0x10) = 0;
  *(undefined **)((long)auStackY_a0 + lVar1 + 8) = &ompi_mpi_info_null;
  *(undefined8 *)((long)auStackY_a0 + lVar1) = 0x134dc0;
  MPI_Dist_graph_create(poVar2,iVar4 != 0,&local_38,&local_34,piVar3,auStack_78 + lVar1);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void mpireorderinglib::MPIX_Dist_graph_create_from_cart_comm(MPI_Comm cart_comm, const int ndims,
															 const int stencil[],
															 const int num_neighbors,
															 const int dims[],
															 const int periods[],
															 MPI_Comm *dist_graph_comm) {

  int cart_rank;
  MPI_Comm_rank(cart_comm, &cart_rank);
  std::vector<int> real_neighbors{};
  mpireorderinglib::get_neighbors_from_stencil(cart_comm, cart_rank,
											   ndims, stencil, num_neighbors, dims,
											   periods, real_neighbors);

  int real_neighbors_size = real_neighbors.size();
  int weights[real_neighbors_size];
  for (int i{0}; i < real_neighbors_size; i++) weights[i] = 0;

  int n_vertices_to_specify{0};
  if (real_neighbors_size) n_vertices_to_specify = 1;

  MPI_Dist_graph_create(cart_comm,
						n_vertices_to_specify,
						&cart_rank,
						&real_neighbors_size,
						real_neighbors.data(),
						weights,
						MPI_INFO_NULL,
						0,
						dist_graph_comm);
}